

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::factory<std::function<double(double)>>
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t N,
          function<double_(double)> *func,double xmin,double xmax)

{
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_00;
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  int k;
  ChebyshevExpansion *index;
  double dVar3;
  VectorXd f;
  VectorXd local_48;
  undefined1 *local_38;
  
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)get_CLnodes((size_t)this);
  local_38 = (undefined1 *)
             ((long)&(this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + 1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_48,(unsigned_long *)&local_38);
  for (index = (ChebyshevExpansion *)0x0; index <= this;
      index = (ChebyshevExpansion *)
              ((long)&(index->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data + 1)) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (this_00,(Index)index);
    dVar3 = std::function<double_(double)>::operator()
                      ((function<double_(double)> *)N,(*pdVar1 * (xmax - xmin) + xmin + xmax) * 0.5)
    ;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,
                        (Index)index);
    *pSVar2 = dVar3;
  }
  factoryf(__return_storage_ptr__,(size_t)this,&local_48,xmin,xmax);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

static ChebyshevExpansion factory(const std::size_t N, const double_function& func, const double xmin, const double xmax)
        {
            // Get the precalculated Chebyshev-Lobatto nodes
            const Eigen::VectorXd & x_nodes_n11 = get_CLnodes(N);

            // Step 1&2: Grid points functional values (function evaluated at the
            // extrema of the Chebyshev polynomial of order N - there are N+1 of them)
            Eigen::VectorXd f(N + 1);
            for (int k = 0; k <= N; ++k) {
                // The extrema in [-1,1] scaled to real-world coordinates
                double x_k = ((xmax - xmin)*x_nodes_n11(k) + (xmax + xmin)) / 2.0;
                f(k) = func(x_k);
            }
            return factoryf(N, f, xmin, xmax);
        }